

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

TRUN_ConfigItem * get_config_items(size_t *nItems)

{
  size_t *nItems_local;
  
  if (nItems != (size_t *)0x0) {
    *nItems = 1;
  }
  return get_config_items::glb_Config;
}

Assistant:

static TRUN_ConfigItem *get_config_items(size_t *nItems) {
    // This should wrap into the Config::instance instead...
    static TRUN_ConfigItem glb_Config[1] = {};
/*
    static TRUN_ConfigItem glb_Config[] = {
            {
                    .isValid = true,
                    .name = "item1",
                    .value_type = kTRCfgType_Num,
                    .value {
                            .num = 1,
                    }
            },
            {
                    .isValid = true,
                    .name = "item2",
                    .value_type = kTRCfgType_Bool,
                    .value {
                            .boolean = false,
                    }
            },
            {
                    .isValid = true,
                    .name = "discardTestReturnCode",
                    .value_type = kTRCfgType_Bool,
                    .value {
                            .boolean = Config::Instance().discardTestReturnCode,
                    }
            },
            {
                    .isValid = true,
                    .name = "item5",
                    .value_type = kTRCfgType_Num,
                    .value {
                            .num = 4711,
                    }
            },
    };
    */
    if (nItems != NULL) {
        *nItems = TRUN_ARRAY_LENGTH(glb_Config);
    }
    return glb_Config;
}